

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

char * DebugNodeTableGetSizingPolicyDesc(ImGuiTableFlags sizing_policy)

{
  uint uVar1;
  ImGuiTableFlags sizing_policy_local;
  char *local_8;
  
  uVar1 = sizing_policy & 0xe000;
  if (uVar1 == 0x2000) {
    local_8 = "FixedFit";
  }
  else if (uVar1 == 0x4000) {
    local_8 = "FixedSame";
  }
  else if (uVar1 == 0x6000) {
    local_8 = "StretchProp";
  }
  else if (uVar1 == 0x8000) {
    local_8 = "StretchSame";
  }
  else {
    local_8 = "N/A";
  }
  return local_8;
}

Assistant:

static const char* DebugNodeTableGetSizingPolicyDesc(ImGuiTableFlags sizing_policy)
{
    sizing_policy &= ImGuiTableFlags_SizingMask_;
    if (sizing_policy == ImGuiTableFlags_SizingFixedFit)    { return "FixedFit"; }
    if (sizing_policy == ImGuiTableFlags_SizingFixedSame)   { return "FixedSame"; }
    if (sizing_policy == ImGuiTableFlags_SizingStretchProp) { return "StretchProp"; }
    if (sizing_policy == ImGuiTableFlags_SizingStretchSame) { return "StretchSame"; }
    return "N/A";
}